

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef lj_opt_fwd_aload(jit_State *J)

{
  IRIns *pIVar1;
  IRIns *pIVar2;
  bool bVar3;
  uint uVar4;
  TRef TVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint xref;
  ulong uVar10;
  
  TVar5 = fwd_ahload(J,(uint)(J->fold).ins.field_0.op1);
  if (TVar5 != 0) {
    return TVar5;
  }
  pIVar1 = (J->cur).ir;
  uVar10 = (ulong)(J->fold).ins.field_0.op1;
  uVar7 = (ulong)*(ushort *)((long)pIVar1 + uVar10 * 8 + 2);
  if ((*(char *)((long)pIVar1 + uVar7 * 8 + 5) == ')') &&
     (uVar6 = (ulong)*(short *)((long)pIVar1 + uVar7 * 8 + 2), -1 < (long)uVar6)) {
    uVar7 = (ulong)pIVar1[uVar7].field_0.op1;
    bVar3 = true;
    if ((*(char *)((long)pIVar1 + uVar7 * 8 + 5) == ')') &&
       ((lVar8 = (long)*(short *)((long)pIVar1 + uVar7 * 8 + 2), -1 < lVar8 &&
        (pIVar1[uVar6].field_1.op12 + pIVar1[lVar8].field_1.op12 == 0)))) {
      xref = (uint)J->chain[0x38];
      uVar4 = pIVar1[uVar7].field_1.op12;
      if ((ushort)pIVar1[uVar7].field_1.op12 < (ushort)pIVar1[uVar10].field_1.op12) {
        uVar4 = pIVar1[uVar10].field_1.op12;
      }
      uVar6 = (ulong)uVar4;
      do {
        bVar3 = xref <= (uVar4 & 0xffff);
        if (xref <= (uVar4 & 0xffff)) goto LAB_0012588e;
        pIVar2 = (J->cur).ir;
        uVar9 = (ulong)xref;
        if ((pIVar2[uVar9].field_0.op1 == pIVar1[uVar10].field_0.op1) &&
           (*(IRRef1 *)((long)pIVar2 + uVar9 * 8 + 2) == pIVar1[uVar7].field_0.op1)) {
          TVar5 = fwd_ahload(J,xref);
          uVar6 = (ulong)TVar5;
          bVar3 = false;
        }
        else {
          xref = (uint)*(ushort *)((long)pIVar2 + uVar9 * 8 + 6);
          bVar3 = true;
        }
      } while (bVar3);
      bVar3 = false;
    }
LAB_0012588e:
    TVar5 = (TRef)uVar6;
    if (!bVar3) goto LAB_00125894;
  }
  TVar5 = 0;
LAB_00125894:
  if (TVar5 != 0) {
    return TVar5;
  }
  TVar5 = lj_ir_emit(J);
  return TVar5;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_aload(jit_State *J)
{
  IRRef ref;
  if ((ref = fwd_ahload(J, fins->op1)) ||
      (ref = fwd_aload_reassoc(J)))
    return ref;
  return EMITFOLD;
}